

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

char * helics::commandErrorString(int errorCode)

{
  size_t sVar1;
  char *pcVar2;
  int in_EDI;
  int local_1c;
  
  local_1c = in_EDI;
  sVar1 = frozen::bits::pmh_tables<16ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
                    ((pmh_tables<16ul,frozen::elsa<int>> *)(errorStrings + 200),&local_1c,
                     (elsa<int> *)(errorStrings + 0x1d0));
  if (sVar1 * 0x18 == 0xc0 || *(int *)(errorStrings + sVar1 * 0x18 + 8) != local_1c) {
    pcVar2 = "unknown";
  }
  else {
    pcVar2 = *(char **)(errorStrings + sVar1 * 0x18 + 0x18);
  }
  return pcVar2;
}

Assistant:

const char* commandErrorString(int errorCode)
{
    const auto* res = errorStrings.find(errorCode);
    return (res != errorStrings.end()) ? res->second.data() : static_cast<const char*>(unknownStr);
}